

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_block_statemach(Curl_easy *data,connectdata *conn)

{
  CURLcode local_2c;
  CURLcode result;
  pingpong *pp;
  ftp_conn *ftpc;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_2c = CURLE_OK;
  do {
    if ((conn->proto).ftpc.state == FTP_STOP) {
      return local_2c;
    }
    local_2c = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,true);
  } while (local_2c == CURLE_OK);
  return local_2c;
}

Assistant:

static CURLcode ftp_block_statemach(struct Curl_easy *data,
                                    struct connectdata *conn)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  CURLcode result = CURLE_OK;

  while(ftpc->state != FTP_STOP) {
    result = Curl_pp_statemach(data, pp, TRUE, TRUE /* disconnecting */);
    if(result)
      break;
  }

  return result;
}